

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenCADFile.cpp
# Opt level: O1

bool __thiscall GenCADFile::parse_dimension_units(GenCADFile *this,mpc_ast_t *header_ast)

{
  mpc_ast_t **ppmVar1;
  int iVar2;
  Dimension DVar3;
  mpc_ast_t *pmVar4;
  mpc_ast_t *pmVar5;
  
  pmVar4 = mpc_ast_get_child(header_ast,"units|>");
  this->m_dimension = INVALID;
  if (pmVar4 == (mpc_ast_t *)0x0) {
    return false;
  }
  if (pmVar4->children_num != 4) {
    return false;
  }
  pmVar5 = mpc_ast_get_child(pmVar4,"unit|dimension|string");
  if (pmVar5 != (mpc_ast_t *)0x0) {
    iVar2 = strcmp(pmVar5->contents,"INCH");
    if (iVar2 == 0) {
      this->m_dimension = INCH;
      return true;
    }
    iVar2 = strcmp(pmVar5->contents,"THOU");
    if (iVar2 == 0) {
      this->m_dimension = THOU;
      return true;
    }
    iVar2 = strcmp(pmVar5->contents,"MM");
    if (iVar2 == 0) {
      this->m_dimension = MM;
      return true;
    }
    iVar2 = strcmp(pmVar5->contents,"MM100");
    if (iVar2 == 0) {
      this->m_dimension = MM100;
      return true;
    }
    return true;
  }
  pmVar4 = mpc_ast_get_child(pmVar4,"unit|dimension|>");
  if (pmVar4->children_num != 3) {
    return false;
  }
  ppmVar1 = pmVar4->children;
  pmVar4 = *ppmVar1;
  if (pmVar4 != (mpc_ast_t *)0x0) {
    iVar2 = strcmp(pmVar4->contents,"USER");
    if (iVar2 == 0) {
      DVar3 = USER;
    }
    else {
      if (pmVar4 == (mpc_ast_t *)0x0) goto LAB_0014d4d4;
      iVar2 = strcmp(pmVar4->contents,"USERM");
      if (iVar2 == 0) {
        DVar3 = USERCM;
      }
      else {
        if ((pmVar4 == (mpc_ast_t *)0x0) || (iVar2 = strcmp(pmVar4->contents,"USERMM"), iVar2 != 0))
        goto LAB_0014d4d4;
        DVar3 = USERMM;
      }
    }
    this->m_dimension = DVar3;
  }
LAB_0014d4d4:
  if (this->m_dimension == INVALID) {
    return false;
  }
  iVar2 = atoi(ppmVar1[2]->contents);
  this->m_dimension_unit = iVar2;
  return true;
}

Assistant:

bool GenCADFile::parse_dimension_units(mpc_ast_t *header_ast) {
	mpc_ast_t *units = mpc_ast_get_child(header_ast, "units|>");
	m_dimension      = INVALID;
	if (!units) return false;

	if (units->children_num == 4) {
		// Try UNITS <unit> format
		mpc_ast_t *unit = mpc_ast_get_child(units, "unit|dimension|string");
		if (unit) {
			if (has_text_content(unit, "INCH")) {
				m_dimension = INCH;
			} else if (has_text_content(unit, "THOU")) {
				m_dimension = THOU;
			} else if (has_text_content(unit, "MM")) {
				m_dimension = MM;
			} else if (has_text_content(unit, "MM100")) {
				m_dimension = MM100;
			}
			return true;
		}

		// UNITS <unit> does not match -> try UNITS <unit> <dimension_unit>
		unit = mpc_ast_get_child(units, "unit|dimension|>");
		if (unit->children_num == 3) {
			mpc_ast_t *start_child = unit->children[0];
			if (has_text_content(start_child, "USER")) {
				m_dimension = USER;
			} else if (has_text_content(start_child, "USERM")) {
				m_dimension = USERCM;
			} else if (has_text_content(start_child, "USERMM")) {
				m_dimension = USERMM;
			}

			if (m_dimension != INVALID) {
				m_dimension_unit = atoi(unit->children[2]->contents);
				return true;
			}
		}
	}

	return false;
}